

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageIO.cpp
# Opt level: O0

int tcu::ImageIO::textureFormatToPNGFormat(TextureFormat *format)

{
  TextureFormat *this;
  bool bVar1;
  InternalError *this_00;
  TextureFormat local_28;
  TextureFormat local_20;
  TextureFormat *local_18;
  TextureFormat *format_local;
  
  local_18 = format;
  TextureFormat::TextureFormat(&local_20,RGB,UNORM_INT8);
  bVar1 = TextureFormat::operator==(format,&local_20);
  this = local_18;
  if (bVar1) {
    format_local._4_4_ = 2;
  }
  else {
    TextureFormat::TextureFormat(&local_28,RGBA,UNORM_INT8);
    bVar1 = TextureFormat::operator==(this,&local_28);
    if (!bVar1) {
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (this_00,"Unsupported texture format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
                 ,0x8e);
      __cxa_throw(this_00,&InternalError::typeinfo,InternalError::~InternalError);
    }
    format_local._4_4_ = 6;
  }
  return format_local._4_4_;
}

Assistant:

static int textureFormatToPNGFormat (const TextureFormat& format)
{
	if (format == TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8))
		return PNG_COLOR_TYPE_RGB;
	else if (format == TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
		return PNG_COLOR_TYPE_RGBA;
	else
		throw InternalError("Unsupported texture format", DE_NULL, __FILE__, __LINE__);
}